

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPassthroughColorLutDataMETA *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  pointer pcVar2;
  uint8_t *__s;
  char cVar3;
  char cVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  string buffer_prefix;
  string buffersize_prefix;
  string buffer_array_prefix;
  ostringstream oss_buffer;
  ostringstream oss_bufferSize;
  ostringstream oss_buffer_array;
  uint8_t auStack_528 [8];
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_520 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)value;
  std::__cxx11::string::_M_construct((ulong)local_320,'\x12');
  *local_320[0]._M_dataplus._M_p = '0';
  local_320[0]._M_dataplus._M_p[1] = 'x';
  pcVar5 = local_320[0]._M_dataplus._M_p + (local_320[0]._M_string_length - 1);
  lVar8 = 0;
  do {
    bVar1 = *(byte *)((long)&local_1a8[0]._M_dataplus._M_p + lVar8);
    *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar8 = lVar8 + 1;
    pcVar5 = pcVar5 + -2;
  } while (lVar8 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            (local_520,type_string,prefix,local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            (local_520,(char (*) [9])"uint32_t",&local_4f8,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_518);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)(local_1a8[0].field_2._M_local_buf + 8 +
           (long)*(uint8_t **)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
       *(uint *)(local_1a8[0].field_2._M_local_buf + 8 +
                (long)*(uint8_t **)(local_1a8[0]._M_dataplus._M_p + -0x18)) & 0xffffffb5 | 8;
  __s = value->buffer;
  if (__s == (uint8_t *)0x0) {
    std::ios::clear((int)(auStack_528 + (long)*(uint8_t **)(local_1a8[0]._M_dataplus._M_p + -0x18))
                    + 0x380);
  }
  else {
    sVar6 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)__s,sVar6);
  }
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
            (local_520,(char (*) [15])"const uint8_t*",&local_518,local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
  }
  if (value->bufferSize != 0) {
    uVar10 = 0;
    do {
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,local_518._M_dataplus._M_p,
                 local_518._M_dataplus._M_p + local_518._M_string_length);
      std::__cxx11::string::append((char *)&local_4d8);
      cVar4 = '\x01';
      if (9 < uVar10) {
        uVar9 = uVar10;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          uVar7 = (uint)uVar9;
          if (uVar7 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_001da3c5;
          }
          if (uVar7 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_001da3c5;
          }
          if (uVar7 < 10000) goto LAB_001da3c5;
          uVar9 = (uVar9 & 0xffffffff) / 10000;
          cVar3 = cVar4 + '\x04';
        } while (99999 < uVar7);
        cVar4 = cVar4 + '\x01';
      }
LAB_001da3c5:
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      std::__cxx11::string::_M_construct((ulong)local_498,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_498[0]._M_dataplus._M_p,(uint)local_498[0]._M_string_length,(uint)uVar10);
      std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_498[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::string::append((char *)&local_4d8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"0x",2);
      *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
           = *(uint *)((long)&local_498[0].field_2 +
                      *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
      local_4b8._M_dataplus._M_p._0_1_ = value->buffer[uVar10];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,(char *)&local_4b8,1);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
                (local_520,(char (*) [15])"const uint8_t*",&local_4d8,&local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4b8._M_dataplus._M_p._1_7_,(uint8_t)local_4b8._M_dataplus._M_p) !=
          &local_4b8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_4b8._M_dataplus._M_p._1_7_,
                                 (uint8_t)local_4b8._M_dataplus._M_p),
                        local_4b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < value->bufferSize);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughColorLutDataMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string buffersize_prefix = prefix;
        buffersize_prefix += "bufferSize";
        std::ostringstream oss_bufferSize;
        oss_bufferSize << "0x" << std::hex << (value->bufferSize);
        contents.emplace_back("uint32_t", buffersize_prefix, oss_bufferSize.str());
        std::string buffer_prefix = prefix;
        buffer_prefix += "buffer";
        std::ostringstream oss_buffer_array;
        oss_buffer_array << std::hex << (value->buffer);
        contents.emplace_back("const uint8_t*", buffer_prefix, oss_buffer_array.str());
        for (uint32_t value_buffer_inc = 0; value_buffer_inc < value->bufferSize; ++value_buffer_inc) {
            std::string buffer_array_prefix = buffer_prefix;
            buffer_array_prefix += "[";
            buffer_array_prefix += std::to_string(value_buffer_inc);
            buffer_array_prefix += "]";
            std::ostringstream oss_buffer;
            oss_buffer << "0x" << std::hex << (value->buffer[value_buffer_inc]);
            contents.emplace_back("const uint8_t*", buffer_array_prefix, oss_buffer.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}